

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AZHighLevelEncoder.cpp
# Opt level: O0

EncodingState * ZXing::Aztec::ShiftAndAppend(EncodingState *state,int mode,int value)

{
  uint uVar1;
  Token TVar2;
  long in_RSI;
  EncodingState *in_RDI;
  bool bVar3;
  vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> tokens;
  int thisModeBitCount;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  EncodingState *this;
  vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  bVar3 = *(int *)(in_RSI + 0x18) == 2;
  uVar1 = bVar3 ^ 5;
  this = in_RDI;
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::vector
            ((vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)
             ((ulong)CONCAT14(bVar3,in_stack_ffffffffffffffe0) ^ 0x500000000),
             in_stack_ffffffffffffffd8);
  std::array<std::array<signed_char,_6UL>,_6UL>::operator[]
            ((array<std::array<signed_char,_6UL>,_6UL> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  std::array<signed_char,_6UL>::operator[]
            ((array<signed_char,_6UL> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  Token::CreateSimple(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::push_back
            ((vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (value_type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  TVar2 = Token::CreateSimple(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::push_back
            ((vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)
             CONCAT44(TVar2,in_stack_ffffffffffffff90),
             (value_type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::vector
            ((vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)
             CONCAT44(uVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  in_RDI->mode = *(int *)(in_RSI + 0x18);
  in_RDI->binaryShiftByteCount = 0;
  in_RDI->bitCount = *(int *)(in_RSI + 0x20) + uVar1 + 5;
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::~vector(&this->tokens);
  return this;
}

Assistant:

static EncodingState ShiftAndAppend(const EncodingState& state, int mode, int value)
{
	//assert binaryShiftByteCount == 0 && this.mode != mode;
	int thisModeBitCount = state.mode == MODE_DIGIT ? 4 : 5;
	// Shifts exist only to UPPER and PUNCT, both with tokens size 5.
	auto tokens = state.tokens;
	tokens.push_back(Token::CreateSimple(SHIFT_TABLE[state.mode][mode], thisModeBitCount));
	tokens.push_back(Token::CreateSimple(value, 5));
	return EncodingState{ tokens, state.mode, 0, state.bitCount + thisModeBitCount + 5 };
}